

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void __thiscall
helics::apps::WebServer::startServer
          (WebServer *this,json *val,shared_ptr<helics::apps::TypedBrokerServer> *ptr)

{
  string_view message;
  bool bVar1;
  invalid_argument *this_00;
  json *in_RSI;
  long in_RDI;
  atomic<bool> *this_01;
  shared_ptr<helics::apps::WebServer> webptr;
  lock_guard<std::mutex> tlock;
  bool exp;
  mutex_type *in_stack_ffffffffffffff38;
  shared_ptr<helics::apps::IocWrapper> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff50;
  json *__r;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  thread *in_stack_ffffffffffffff70;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff80;
  memory_order in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  thread in_stack_ffffffffffffff90;
  atomic<bool> *in_stack_ffffffffffffff98;
  __shared_ptr local_58 [47];
  undefined1 local_29;
  json *local_10;
  
  local_10 = in_RSI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  message._M_str = (char *)in_stack_ffffffffffffff40;
  message._M_len = (size_t)in_stack_ffffffffffffff38;
  TypedBrokerServer::logMessage(message);
  __r = local_10;
  if (local_10 == (json *)0x0) {
    __r = &::null_abi_cxx11_;
  }
  *(json **)(in_RDI + 0x50) = __r;
  local_29 = 0;
  bVar1 = CLI::std::atomic<bool>::compare_exchange_strong
                    (in_stack_ffffffffffffff98,(bool *)in_stack_ffffffffffffff90._M_id._M_thread,
                     (bool)in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88);
  if (bVar1) {
    CLI::std::make_shared<helics::apps::IocWrapper>();
    CLI::std::shared_ptr<helics::apps::IocWrapper>::operator=
              (in_stack_ffffffffffffff40,
               (shared_ptr<helics::apps::IocWrapper> *)in_stack_ffffffffffffff38);
    CLI::std::shared_ptr<helics::apps::IocWrapper>::~shared_ptr
              ((shared_ptr<helics::apps::IocWrapper> *)0x219827);
    CLI::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::dynamic_pointer_cast<helics::apps::WebServer,helics::apps::TypedBrokerServer>
              ((shared_ptr<helics::apps::TypedBrokerServer> *)__r);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_58);
    if (!bVar1) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"pointer to a webserver required for operation");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    CLI::std::shared_ptr<helics::apps::WebServer>::shared_ptr
              ((shared_ptr<helics::apps::WebServer> *)in_stack_ffffffffffffff40,
               (shared_ptr<helics::apps::WebServer> *)in_stack_ffffffffffffff38);
    std::thread::
    thread<helics::apps::WebServer::startServer(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const*,std::shared_ptr<helics::apps::TypedBrokerServer>const&)::__0,,void>
              (in_stack_ffffffffffffff70,
               (type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    this_01 = (atomic<bool> *)(in_RDI + 0x20);
    CLI::std::thread::operator=
              ((thread *)&stack0xffffffffffffff90,(thread *)in_stack_ffffffffffffff38);
    CLI::std::thread::~thread((thread *)0x21991e);
    startServer(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const*,std::shared_ptr<helics::apps::TypedBrokerServer>const&)
    ::$_0::~__0((type *)0x219928);
    std::thread::detach();
    CLI::std::this_thread::yield();
    while (bVar1 = std::atomic::operator_cast_to_bool(this_01), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffff70,
                 (int *)&stack0xffffffffffffff6c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffff80);
    }
    CLI::std::shared_ptr<helics::apps::WebServer>::~shared_ptr
              ((shared_ptr<helics::apps::WebServer> *)0x21999d);
    CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2199aa);
  }
  return;
}

Assistant:

void WebServer::startServer(const nlohmann::json* val,
                            const std::shared_ptr<TypedBrokerServer>& ptr)
{
    logMessage("starting broker web server");
    config = (val != nullptr) ? val : &null;
    bool exp{false};
    if (running.compare_exchange_strong(exp, true)) {
        // The io_context is required for all I/O
        context = std::make_shared<IocWrapper>();

        const std::lock_guard<std::mutex> tlock(threadGuard);

        auto webptr = std::dynamic_pointer_cast<WebServer>(ptr);
        if (!webptr) {
            throw(std::invalid_argument("pointer to a webserver required for operation"));
        }
        mainLoopThread = std::thread([this, webptr = std::move(webptr)]() { mainLoop(webptr); });
        mainLoopThread.detach();
        std::this_thread::yield();
        while (!executing) {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
}